

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLine.cpp
# Opt level: O1

bool llvm::cl::ExpandResponseFiles
               (StringSaver *Saver,TokenizerCallback Tokenizer,SmallVectorImpl<const_char_*> *Argv,
               bool MarkEOLs,bool RelativeNames)

{
  char *pcVar1;
  byte bVar2;
  bool bVar3;
  uint uVar4;
  size_t sVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  uint uVar9;
  bool bVar10;
  StringRef FName;
  SmallVector<const_char_*,_0U> ExpandedArgv;
  SmallVectorImpl<const_char_*> local_60;
  undefined8 local_50;
  uint local_48;
  uint local_44;
  StringSaver *local_40;
  TokenizerCallback local_38;
  
  uVar6 = (Argv->super_SmallVectorTemplateBase<const_char_*,_true>).
          super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.Size;
  bVar10 = uVar6 == 0;
  if (!bVar10) {
    bVar2 = 1;
    uVar8 = 0;
    local_48 = (uint)RelativeNames;
    local_50._4_4_ = (uint)MarkEOLs;
    uVar9 = 0;
    uVar4 = 0;
    local_40 = Saver;
    local_38 = Tokenizer;
    do {
      if (uVar6 <= uVar9) {
        __assert_fail("idx < size()",
                      "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/include/llvm/ADT/SmallVector.h"
                      ,0x9b,
                      "reference llvm::SmallVectorTemplateCommon<const char *>::operator[](size_type) [T = const char *]"
                     );
      }
      pcVar1 = *(char **)((long)(Argv->super_SmallVectorTemplateBase<const_char_*,_true>).
                                super_SmallVectorTemplateCommon<const_char_*,_void>.
                                super_SmallVectorBase.BeginX + uVar8 * 8);
      if ((pcVar1 == (char *)0x0) || (*pcVar1 != '@')) {
        uVar9 = uVar9 + 1;
        iVar7 = 3;
      }
      else {
        uVar6 = uVar4 + 1;
        iVar7 = 1;
        bVar3 = uVar4 < 0x15;
        uVar4 = uVar6;
        if (bVar3) {
          local_60.super_SmallVectorTemplateBase<const_char_*,_true>.
          super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.BeginX =
               &local_50;
          local_60.super_SmallVectorTemplateBase<const_char_*,_true>.
          super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.Size = 0;
          local_60.super_SmallVectorTemplateBase<const_char_*,_true>.
          super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.Capacity = 0;
          local_44 = uVar6;
          sVar5 = strlen(pcVar1 + 1);
          FName.Length = sVar5;
          FName.Data = pcVar1 + 1;
          bVar3 = ExpandResponseFile(FName,local_40,local_38,&local_60,SUB41(local_50._4_4_,0),
                                     SUB41(local_48,0));
          if (bVar3) {
            SmallVectorImpl<const_char_*>::erase
                      (Argv,(const_iterator)
                            ((long)(Argv->super_SmallVectorTemplateBase<const_char_*,_true>).
                                   super_SmallVectorTemplateCommon<const_char_*,_void>.
                                   super_SmallVectorBase.BeginX + uVar8 * 8));
            SmallVectorImpl<char_const*>::insert<char_const**,void>
                      ((SmallVectorImpl<char_const*> *)Argv,
                       (iterator)
                       (uVar8 * 8 +
                       (long)(Argv->super_SmallVectorTemplateBase<const_char_*,_true>).
                             super_SmallVectorTemplateCommon<const_char_*,_void>.
                             super_SmallVectorBase.BeginX),
                       (char **)local_60.super_SmallVectorTemplateBase<const_char_*,_true>.
                                super_SmallVectorTemplateCommon<const_char_*,_void>.
                                super_SmallVectorBase.BeginX,
                       (char **)((long)local_60.super_SmallVectorTemplateBase<const_char_*,_true>.
                                       super_SmallVectorTemplateCommon<const_char_*,_void>.
                                       super_SmallVectorBase.BeginX +
                                (local_60.super_SmallVectorTemplateBase<const_char_*,_true>.
                                 super_SmallVectorTemplateCommon<const_char_*,_void>.
                                 super_SmallVectorBase._8_8_ & 0xffffffff) * 8));
            iVar7 = 0;
          }
          else {
            uVar9 = uVar9 + 1;
            iVar7 = 3;
            bVar2 = 0;
          }
          uVar4 = local_44;
          if ((undefined8 *)
              local_60.super_SmallVectorTemplateBase<const_char_*,_true>.
              super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.BeginX !=
              &local_50) {
            free(local_60.super_SmallVectorTemplateBase<const_char_*,_true>.
                 super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.BeginX);
            uVar4 = local_44;
          }
        }
      }
      if ((iVar7 != 3) && (iVar7 != 0)) break;
      uVar8 = (ulong)uVar9;
      uVar6 = (Argv->super_SmallVectorTemplateBase<const_char_*,_true>).
              super_SmallVectorTemplateCommon<const_char_*,_void>.super_SmallVectorBase.Size;
      bVar10 = uVar6 == uVar9;
    } while (!bVar10);
    bVar10 = (bool)(bVar10 & bVar2);
  }
  return bVar10;
}

Assistant:

bool cl::ExpandResponseFiles(StringSaver &Saver, TokenizerCallback Tokenizer,
                             SmallVectorImpl<const char *> &Argv,
                             bool MarkEOLs, bool RelativeNames) {
  unsigned RspFiles = 0;
  bool AllExpanded = true;

  // Don't cache Argv.size() because it can change.
  for (unsigned I = 0; I != Argv.size();) {
    const char *Arg = Argv[I];
    // Check if it is an EOL marker
    if (Arg == nullptr) {
      ++I;
      continue;
    }
    if (Arg[0] != '@') {
      ++I;
      continue;
    }

    // If we have too many response files, leave some unexpanded.  This avoids
    // crashing on self-referential response files.
    if (RspFiles++ > 20)
      return false;

    // Replace this response file argument with the tokenization of its
    // contents.  Nested response files are expanded in subsequent iterations.
    SmallVector<const char *, 0> ExpandedArgv;
    if (!ExpandResponseFile(Arg + 1, Saver, Tokenizer, ExpandedArgv,
                            MarkEOLs, RelativeNames)) {
      // We couldn't read this file, so we leave it in the argument stream and
      // move on.
      AllExpanded = false;
      ++I;
      continue;
    }
    Argv.erase(Argv.begin() + I);
    Argv.insert(Argv.begin() + I, ExpandedArgv.begin(), ExpandedArgv.end());
  }
  return AllExpanded;
}